

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O3

void update_ref_speed(SpurUserParamsPtr spur)

{
  double dVar1;
  OdometryPtr p_Var2;
  long lVar3;
  
  lVar3 = 0;
  p_Var2 = get_odometry_ptr();
  do {
    spur->wheel_vel_smooth[lVar3] = p_Var2->wvel[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  dVar1 = p_Var2->w;
  spur->vref_smooth = p_Var2->v;
  spur->wref_smooth = dVar1;
  return;
}

Assistant:

void update_ref_speed(SpurUserParamsPtr spur)
{
  OdometryPtr podm;
  int i;

  podm = get_odometry_ptr();
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    spur->wheel_vel_smooth[i] = podm->wvel[i];
  }
  spur->vref_smooth = podm->v;
  spur->wref_smooth = podm->w;
}